

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_forest.hpp
# Opt level: O1

void __thiscall
pico_tree::
kd_forest<std::reference_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>const>,pico_tree::metric_l2_squared,int>
::
search_nearest<pico_tree::internal::point_wrapper<std::array<float,784ul>>,pico_tree::internal::search_nn<pico_tree::neighbor<int,float>>>
          (kd_forest<std::reference_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>const>,pico_tree::metric_l2_squared,int>
           *this,long point,ulong max_leaves_visited,
          search_nn<pico_tree::neighbor<int,_float>_> *visitor)

{
  scalar_type *psVar1;
  float *pfVar2;
  float *pfVar3;
  node_type *node;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  bool bVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  float fVar17;
  point<float,_784UL> p;
  float local_ce4;
  kd_forest<std::reference_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>const>,pico_tree::metric_l2_squared,int>
  *local_ce0;
  ulong local_cd8;
  search_nn<pico_tree::neighbor<int,_float>_> *local_cd0;
  kd_tree_node_topological<int,_float> *local_cc8;
  undefined1 local_cc0 [40];
  pointer local_c98;
  pointer ppStack_c90;
  pointer local_c88;
  search_nn<pico_tree::neighbor<int,_float>_> *local_c78;
  point_type local_c70;
  
  lVar16 = *(long *)(this + 0x10);
  if (*(long *)(this + 0x18) != lVar16) {
    lVar13 = 0;
    uVar12 = 0;
    local_ce0 = this;
    local_cd8 = max_leaves_visited;
    local_cd0 = visitor;
    do {
      lVar14 = uVar12 * 0x2520 + lVar16;
      memset(&local_c70,0,0xc40);
      fVar17 = 0.0;
      lVar11 = 0;
      do {
        fVar17 = fVar17 + *(float *)(lVar16 + lVar13 + lVar11 * 4) * *(float *)(point + lVar11 * 4);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x310);
      fVar17 = fVar17 * -2.0;
      lVar11 = 0;
      do {
        pfVar2 = (float *)(point + lVar11 * 4);
        fVar4 = pfVar2[1];
        fVar5 = pfVar2[2];
        fVar6 = pfVar2[3];
        pfVar3 = (float *)(lVar16 + lVar13 + lVar11 * 4);
        fVar7 = pfVar3[1];
        fVar8 = pfVar3[2];
        fVar9 = pfVar3[3];
        local_c70.elems_._M_elems[lVar11] = *pfVar3 * fVar17 + *pfVar2;
        local_c70.elems_._M_elems[lVar11 + 1] = fVar7 * fVar17 + fVar4;
        local_c70.elems_._M_elems[lVar11 + 2] = fVar8 * fVar17 + fVar5;
        local_c70.elems_._M_elems[lVar11 + 3] = fVar9 * fVar17 + fVar6;
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0x310);
      local_cc0._0_8_ = lVar14 + 0xc40;
      local_cc0._16_8_ = lVar14 + 0xc60;
      local_cc0._24_8_ = &local_c70;
      local_cc0._32_8_ = local_cd8;
      local_c98 = (pointer)0x0;
      ppStack_c90 = (pointer)0x0;
      local_c88 = (pointer)0x0;
      local_c78 = local_cd0;
      local_cc8 = *(kd_tree_node_topological<int,_float> **)(lVar14 + 0x2518);
      local_ce4 = 0.0;
      ::std::
      priority_queue<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>,std::vector<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>,std::allocator<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>>>,std::greater<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>>>
      ::emplace<float,pico_tree::internal::kd_tree_node_topological<int,float>const*const&>
                ((priority_queue<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>,std::vector<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>,std::allocator<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>>>,std::greater<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>>>
                  *)&local_c98,&local_ce4,&local_cc8);
      uVar15 = 0;
      do {
        if (local_c98 == ppStack_c90) break;
        if (uVar15 < (ulong)local_cc0._32_8_) {
          fVar17 = local_c98->first;
          psVar1 = &local_c78->nn_->distance;
          if (*psVar1 <= fVar17 && fVar17 != *psVar1) goto LAB_00107a83;
          node = local_c98->second;
          std::
          priority_queue<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>,_std::vector<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>,_std::allocator<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>_>_>,_std::greater<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>_>_>
          ::pop((priority_queue<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>,_std::vector<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>,_std::allocator<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>_>_>,_std::greater<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>_>_>
                 *)&local_c98);
          internal::
          priority_search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::internal::point<float,_784UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
          ::search_nearest((priority_search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::internal::point<float,_784UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
                            *)local_cc0,node,fVar17);
          uVar15 = uVar15 + 1;
          bVar10 = true;
        }
        else {
LAB_00107a83:
          bVar10 = false;
        }
      } while (bVar10);
      if (local_c98 != (pointer)0x0) {
        operator_delete(local_c98,(long)local_c88 - (long)local_c98);
      }
      uVar12 = uVar12 + 1;
      lVar16 = *(long *)(local_ce0 + 0x10);
      lVar13 = lVar13 + 0x2520;
    } while (uVar12 < (ulong)((*(long *)(local_ce0 + 0x18) - lVar16 >> 5) * 0x3a9ce01b951e2b19));
  }
  return;
}

Assistant:

inline void search_nearest(
      PointWrapper_ point,
      size_type max_leaves_visited,
      Visitor_& visitor,
      euclidean_space_tag) const {
    // Range based for loop (rightfully) results in a warning that shouldn't be
    // needed if the user creates the forest with at least a single tree.
    for (std::size_t i = 0; i < data_.size(); ++i) {
      auto p = data_[i].rotate_point(point);
      using point_wrapper_type = internal::point_wrapper<decltype(p)>;
      point_wrapper_type point_wrapper(p);
      internal::priority_search_nearest_euclidean<
          typename rkd_tree_data_type::space_wrapper_type,
          Metric_,
          point_wrapper_type,
          Visitor_,
          index_type>(
          typename rkd_tree_data_type::space_wrapper_type(data_[i].space),
          metric_,
          data_[i].tree.indices,
          point_wrapper,
          max_leaves_visited,
          visitor)(data_[i].tree.root_node);
    }
  }